

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmime_flbi.c
# Opt level: O1

char * cmime_flbi_boundary_linebreak(char *s,char *linebreak)

{
  char *__src;
  size_t sVar1;
  char *__dest;
  
  __src = strstr(s,linebreak);
  if (__src == (char *)0x0) {
    __dest = (char *)0x0;
  }
  else {
    sVar1 = strlen(linebreak);
    __dest = (char *)calloc((long)(int)sVar1 + 1,1);
    strncpy(__dest,__src,(long)(int)sVar1);
    sVar1 = strlen(__dest);
    __dest[sVar1] = '\0';
  }
  return __dest;
}

Assistant:

char *cmime_flbi_boundary_linebreak(char *s, char *linebreak) {
    char *out = NULL;
    char *p = NULL;
    int len;

    p = strstr(s,linebreak);
    if (p!=NULL) {
        len = strlen(linebreak);
        out = (char *)calloc(len + sizeof(char), sizeof(char));
        strncpy(out,p,len);
        out[strlen(out)] = '\0';
    }

    return(out);   
}